

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::AssignDescriptorsHelper::AssignMessageDescriptor
          (AssignDescriptorsHelper *this,Descriptor *descriptor)

{
  int iVar1;
  void *pvVar2;
  EnumDescriptor *descriptor_00;
  AssignDescriptorsHelper *in_RSI;
  ReflectionSchema *in_RDI;
  int in_R9D;
  MigrationSchema migration_schema;
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  int iVar3;
  undefined4 in_stack_ffffffffffffff8c;
  Reflection *in_stack_ffffffffffffff90;
  ReflectionSchema local_48;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar4;
  AssignDescriptorsHelper *this_00;
  
  iVar4 = 0;
  while( true ) {
    iVar3 = iVar4;
    iVar1 = Descriptor::nested_type_count((Descriptor *)in_RSI);
    if (iVar1 <= iVar4) break;
    Descriptor::nested_type((Descriptor *)in_RSI,iVar3);
    AssignMessageDescriptor(in_RSI,(Descriptor *)CONCAT44(iVar3,in_stack_ffffffffffffffe8));
    iVar4 = iVar3 + 1;
  }
  *(AssignDescriptorsHelper **)in_RDI->offsets_ = in_RSI;
  pvVar2 = operator_new(0x50);
  migration_schema.has_bit_indices_index = 0;
  migration_schema.offsets_index = *(uint *)(*(undefined8 **)&in_RDI->has_bits_offset_ + 1);
  migration_schema.object_size = in_R9D;
  this_00 = in_RSI;
  anon_unknown_0::MigrationToReflectionSchema
            (&local_48,*(anon_unknown_0 **)&in_RDI->extensions_offset_,
             *(Message ***)&in_RDI->object_size_,
             (uint32 *)**(undefined8 **)&in_RDI->has_bits_offset_,migration_schema);
  DescriptorPool::internal_generated_pool();
  Reflection::Reflection
            (in_stack_ffffffffffffff90,
             (Descriptor *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI,
             (DescriptorPool *)CONCAT44(iVar4,in_stack_ffffffffffffff78),(MessageFactory *)in_RSI);
  *(void **)(in_RDI->offsets_ + 2) = pvVar2;
  iVar4 = 0;
  while( true ) {
    iVar3 = iVar4;
    iVar1 = Descriptor::enum_type_count((Descriptor *)this_00);
    if (iVar1 <= iVar4) break;
    descriptor_00 = Descriptor::enum_type((Descriptor *)this_00,iVar3);
    AssignEnumDescriptor((AssignDescriptorsHelper *)in_RDI,descriptor_00);
    iVar4 = iVar3 + 1;
  }
  *(long *)&in_RDI->has_bits_offset_ = *(long *)&in_RDI->has_bits_offset_ + 0xc;
  *(long *)&in_RDI->extensions_offset_ = *(long *)&in_RDI->extensions_offset_ + 8;
  in_RDI->offsets_ = in_RDI->offsets_ + 4;
  return;
}

Assistant:

void AssignMessageDescriptor(const Descriptor* descriptor) {
    for (int i = 0; i < descriptor->nested_type_count(); i++) {
      AssignMessageDescriptor(descriptor->nested_type(i));
    }

    file_level_metadata_->descriptor = descriptor;

    file_level_metadata_->reflection =
        new Reflection(descriptor,
                       MigrationToReflectionSchema(default_instance_data_,
                                                   offsets_, *schemas_),
                       DescriptorPool::internal_generated_pool(), factory_);
    for (int i = 0; i < descriptor->enum_type_count(); i++) {
      AssignEnumDescriptor(descriptor->enum_type(i));
    }
    schemas_++;
    default_instance_data_++;
    file_level_metadata_++;
  }